

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

void ZSTD_decompressSequencesSplitLitBuffer_bmi2_cold_1(void)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  undefined8 *puVar5;
  ulong *in_RDX;
  ulong *in_RSI;
  undefined8 *in_RDI;
  
  uVar4 = *(uint *)(in_RDI + 1);
  if (uVar4 < 0x41) {
    uVar1 = in_RDI[2];
    if (uVar1 < *in_RSI) {
      uVar2 = *in_RDX;
      if (uVar1 == uVar2) {
        return;
      }
      uVar3 = (int)uVar1 - (int)uVar2;
      if (uVar2 <= uVar1 - (uVar4 >> 3)) {
        uVar3 = uVar4 >> 3;
      }
      puVar5 = (undefined8 *)(uVar1 - uVar3);
      in_RDI[2] = puVar5;
      uVar4 = uVar4 + uVar3 * -8;
    }
    else {
      puVar5 = (undefined8 *)(uVar1 - (uVar4 >> 3));
      in_RDI[2] = puVar5;
      uVar4 = uVar4 & 7;
    }
    *(uint *)(in_RDI + 1) = uVar4;
    *in_RDI = *puVar5;
  }
  return;
}

Assistant:

BIT_DStream_status BIT_reloadDStream(BIT_DStream_t* bitD)
{
    if (bitD->bitsConsumed > (sizeof(bitD->bitContainer)*8))  /* overflow detected, like end of stream */
        return BIT_DStream_overflow;

    if (bitD->ptr >= bitD->limitPtr) {
        return BIT_reloadDStreamFast(bitD);
    }
    if (bitD->ptr == bitD->start) {
        if (bitD->bitsConsumed < sizeof(bitD->bitContainer)*8) return BIT_DStream_endOfBuffer;
        return BIT_DStream_completed;
    }
    /* start < ptr < limitPtr */
    {   U32 nbBytes = bitD->bitsConsumed >> 3;
        BIT_DStream_status result = BIT_DStream_unfinished;
        if (bitD->ptr - nbBytes < bitD->start) {
            nbBytes = (U32)(bitD->ptr - bitD->start);  /* ptr > start */
            result = BIT_DStream_endOfBuffer;
        }
        bitD->ptr -= nbBytes;
        bitD->bitsConsumed -= nbBytes*8;
        bitD->bitContainer = MEM_readLEST(bitD->ptr);   /* reminder : srcSize > sizeof(bitD->bitContainer), otherwise bitD->ptr == bitD->start */
        return result;
    }
}